

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall DPolyobjInterpolation::Interpolate(DPolyobjInterpolation *this,double smoothratio)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  vertex_t *this_00;
  bool bVar5;
  uint uVar6;
  vertex_t **ppvVar7;
  double *pdVar8;
  double dVar9;
  uint local_20;
  uint i;
  bool changed;
  double smoothratio_local;
  DPolyobjInterpolation *this_local;
  
  bVar5 = false;
  local_20 = 0;
  do {
    uVar6 = TArray<vertex_t_*,_vertex_t_*>::Size(&this->poly->Vertices);
    if (uVar6 <= local_20) {
      if (((this->super_DInterpolation).refcount != 0) || (bVar5)) {
        this->bakcx = (this->poly->CenterSpot).pos.X;
        this->bakcy = (this->poly->CenterSpot).pos.Y;
        (this->poly->CenterSpot).pos.X = this->bakcx + (this->bakcx - this->oldcx) * smoothratio;
        (this->poly->CenterSpot).pos.Y = this->bakcy + (this->bakcy - this->oldcy) * smoothratio;
        FPolyObj::ClearSubsectorLinks(this->poly);
      }
      else {
        (*(this->super_DInterpolation).super_DObject._vptr_DObject[4])();
      }
      return;
    }
    ppvVar7 = TArray<vertex_t_*,_vertex_t_*>::operator[](&this->poly->Vertices,(ulong)local_20);
    dVar9 = vertex_t::fX(*ppvVar7);
    pdVar8 = TArray<double,_double>::operator[](&this->bakverts,(ulong)(local_20 << 1));
    *pdVar8 = dVar9;
    ppvVar7 = TArray<vertex_t_*,_vertex_t_*>::operator[](&this->poly->Vertices,(ulong)local_20);
    dVar9 = vertex_t::fY(*ppvVar7);
    pdVar8 = TArray<double,_double>::operator[](&this->bakverts,(ulong)(local_20 * 2 + 1));
    *pdVar8 = dVar9;
    pdVar8 = TArray<double,_double>::operator[](&this->bakverts,(ulong)(local_20 << 1));
    dVar9 = *pdVar8;
    pdVar8 = TArray<double,_double>::operator[](&this->oldverts,(ulong)(local_20 << 1));
    if ((dVar9 != *pdVar8) || (NAN(dVar9) || NAN(*pdVar8))) {
LAB_009071e4:
      bVar5 = true;
      ppvVar7 = TArray<vertex_t_*,_vertex_t_*>::operator[](&this->poly->Vertices,(ulong)local_20);
      this_00 = *ppvVar7;
      pdVar8 = TArray<double,_double>::operator[](&this->oldverts,(ulong)(local_20 << 1));
      dVar9 = *pdVar8;
      pdVar8 = TArray<double,_double>::operator[](&this->bakverts,(ulong)(local_20 << 1));
      dVar1 = *pdVar8;
      pdVar8 = TArray<double,_double>::operator[](&this->oldverts,(ulong)(local_20 << 1));
      dVar2 = *pdVar8;
      pdVar8 = TArray<double,_double>::operator[](&this->oldverts,(ulong)(local_20 * 2 + 1));
      dVar3 = *pdVar8;
      pdVar8 = TArray<double,_double>::operator[](&this->bakverts,(ulong)(local_20 * 2 + 1));
      dVar4 = *pdVar8;
      pdVar8 = TArray<double,_double>::operator[](&this->oldverts,(ulong)(local_20 * 2 + 1));
      vertex_t::set(this_00,dVar9 + (dVar1 - dVar2) * smoothratio,
                    dVar3 + (dVar4 - *pdVar8) * smoothratio);
    }
    else {
      pdVar8 = TArray<double,_double>::operator[](&this->bakverts,(ulong)(local_20 * 2 + 1));
      dVar9 = *pdVar8;
      pdVar8 = TArray<double,_double>::operator[](&this->oldverts,(ulong)(local_20 * 2 + 1));
      if ((dVar9 != *pdVar8) || (NAN(dVar9) || NAN(*pdVar8))) goto LAB_009071e4;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void DPolyobjInterpolation::Interpolate(double smoothratio)
{
	bool changed = false;
	for(unsigned int i = 0; i < poly->Vertices.Size(); i++)
	{
		bakverts[i*2  ] = poly->Vertices[i]->fX();
		bakverts[i*2+1] = poly->Vertices[i]->fY();

		if (bakverts[i * 2] != oldverts[i * 2] || bakverts[i * 2 + 1] != oldverts[i * 2 + 1])
		{
			changed = true;
			poly->Vertices[i]->set(
				oldverts[i * 2] + (bakverts[i * 2] - oldverts[i * 2]) * smoothratio,
				oldverts[i * 2 + 1] + (bakverts[i * 2 + 1] - oldverts[i * 2 + 1]) * smoothratio);
		}
	}
	if (refcount == 0 && !changed)
	{
		Destroy();
	}
	else
	{
		bakcx = poly->CenterSpot.pos.X;
		bakcy = poly->CenterSpot.pos.Y;
		poly->CenterSpot.pos.X = bakcx + (bakcx - oldcx) * smoothratio;
		poly->CenterSpot.pos.Y = bakcy + (bakcy - oldcy) * smoothratio;

		poly->ClearSubsectorLinks();
	}
}